

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O3

Llb_Grp_t * Llb_ManGroupCreateFirst(Llb_Man_t *pMan)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *pVVar3;
  Llb_Grp_t *pLVar4;
  Aig_Man_t *pAVar5;
  void **ppvVar6;
  uint uVar7;
  int iVar8;
  
  pLVar4 = Llb_ManGroupAlloc(pMan);
  pAVar5 = pMan->pAig;
  if (0 < pAVar5->nRegs) {
    iVar8 = 0;
    do {
      uVar7 = pAVar5->nTruePis + iVar8;
      if (((int)uVar7 < 0) || (pAVar5->vCis->nSize <= (int)uVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar2 = pAVar5->vCis->pArray[uVar7];
      pVVar3 = pLVar4->vOuts;
      uVar7 = pVVar3->nSize;
      if (uVar7 == pVVar3->nCap) {
        if ((int)uVar7 < 0x10) {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar3->pArray,0x80);
          }
          pVVar3->pArray = ppvVar6;
          pVVar3->nCap = 0x10;
        }
        else {
          if (pVVar3->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar3->pArray,(ulong)uVar7 << 4);
          }
          pVVar3->pArray = ppvVar6;
          pVVar3->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar6 = pVVar3->pArray;
      }
      iVar1 = pVVar3->nSize;
      pVVar3->nSize = iVar1 + 1;
      ppvVar6[iVar1] = pvVar2;
      iVar8 = iVar8 + 1;
      pAVar5 = pMan->pAig;
    } while (iVar8 < pAVar5->nRegs);
  }
  return pLVar4;
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreateFirst( Llb_Man_t * pMan )
{
    Llb_Grp_t * p;
    Aig_Obj_t * pObj;
    int i;
    p = Llb_ManGroupAlloc( pMan );
    Saig_ManForEachLo( pMan->pAig, pObj, i )
        Vec_PtrPush( p->vOuts, pObj );
    return p;
}